

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleImageTests.cpp
# Opt level: O2

void vkt::pipeline::anon_unknown_0::addTestCasesWithFunctions
               (TestCaseGroup *group,Function initPrograms,Function testFunc)

{
  VkSampleCountFlagBits VVar1;
  TestContext *pTVar2;
  TestCaseGroup *pTVar3;
  ostream *poVar4;
  char *__s;
  TestNode *node;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  allocator<char> local_2d5;
  int local_2d4;
  TestNode *local_2d0;
  Vector<int,_2> *local_2c8;
  VkFormat local_2bc;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> formatGroup;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> sizeLayerGroup;
  string local_270;
  undefined1 local_250 [36];
  CaseDef caseDef;
  Vector<int,_2> local_218 [2];
  string local_208;
  CaseDef local_1e4;
  CaseDef local_1d0;
  CaseDef local_1bc;
  string name;
  
  local_218[0].m_data[0] = 0x40;
  local_218[0].m_data[1] = 0x40;
  local_218[1].m_data[0] = 0x4f;
  local_218[1].m_data[1] = 0x1f;
  lVar5 = 0;
  local_2d0 = &group->super_TestNode;
  for (; lVar5 != 2; lVar5 = lVar5 + 1) {
    local_2c8 = local_218 + lVar5;
    for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
      pTVar3 = (TestCaseGroup *)operator_new(0x70);
      pTVar2 = local_2d0->m_testCtx;
      local_2d4 = (&DAT_00982f64)[lVar6];
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
      poVar4 = (ostream *)std::ostream::operator<<(&name,local_2c8->m_data[0]);
      poVar4 = std::operator<<(poVar4,"x");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_2c8->m_data[1]);
      poVar4 = std::operator<<(poVar4,"_");
      std::ostream::operator<<(poVar4,local_2d4);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
      tcu::TestCaseGroup::TestCaseGroup(pTVar3,pTVar2,(char *)local_250._0_8_,"");
      sizeLayerGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
      m_data.ptr = pTVar3;
      std::__cxx11::string::~string((string *)local_250);
      for (lVar8 = 0;
          pTVar3 = sizeLayerGroup.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                   m_data.ptr, lVar8 != 4; lVar8 = lVar8 + 1) {
        pTVar3 = (TestCaseGroup *)operator_new(0x70);
        pTVar2 = local_2d0->m_testCtx;
        local_2bc = (&DAT_009824c0)[lVar8];
        __s = ::vk::getFormatName(local_2bc);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&name,__s,(allocator<char> *)local_250);
        std::__cxx11::string::substr((ulong)local_250,(ulong)&name);
        de::toLower(&local_270,(string *)local_250);
        std::__cxx11::string::~string((string *)local_250);
        std::__cxx11::string::~string((string *)&name);
        tcu::TestCaseGroup::TestCaseGroup(pTVar3,pTVar2,local_270._M_dataplus._M_p,"");
        formatGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
        m_data.ptr = pTVar3;
        std::__cxx11::string::~string((string *)&local_270);
        for (lVar7 = 0;
            pTVar3 = formatGroup.
                     super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                     m_data.ptr, lVar7 != 0x18; lVar7 = lVar7 + 4) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
          poVar4 = std::operator<<((ostream *)&name,"samples_");
          VVar1 = *(VkSampleCountFlagBits *)((long)&DAT_00982510 + lVar7);
          std::ostream::operator<<(poVar4,VVar1);
          tcu::Vector<int,_2>::Vector(&caseDef.renderSize,local_2c8);
          pTVar3 = formatGroup.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                   m_data.ptr;
          caseDef.numLayers = local_2d4;
          caseDef.colorFormat = local_2bc;
          caseDef.numSamples = VVar1;
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"",&local_2d5);
          CaseDef::CaseDef(&local_1d0,&caseDef);
          pTVar2 = (pTVar3->super_TestNode).m_testCtx;
          CaseDef::CaseDef(&local_1e4,&local_1d0);
          node = (TestNode *)operator_new(0x98);
          CaseDef::CaseDef(&local_1bc,&local_1e4);
          local_250._0_8_ = testFunc;
          CaseDef::CaseDef((CaseDef *)(local_250 + 8),&local_1bc);
          TestCase::TestCase((TestCase *)node,pTVar2,NODETYPE_SELF_VALIDATE,&local_270,&local_208);
          node->_vptr_TestNode = (_func_int **)&PTR__TestCase_00bfc910;
          node[1]._vptr_TestNode = (_func_int **)initPrograms;
          FunctionInstance1<vkt::pipeline::(anonymous_namespace)::CaseDef>::Args::Args
                    ((Args *)&node[1].m_testCtx,(Args *)local_250);
          tcu::TestNode::addChild(&pTVar3->super_TestNode,node);
          std::__cxx11::string::~string((string *)&local_208);
          std::__cxx11::string::~string((string *)&local_270);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
        }
        formatGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
        m_data.ptr = (TestCaseGroup *)0x0;
        tcu::TestNode::addChild
                  (&(sizeLayerGroup.
                     super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                     m_data.ptr)->super_TestNode,&pTVar3->super_TestNode);
        de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
        ~UniqueBase(&formatGroup.
                     super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
      }
      sizeLayerGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
      m_data.ptr = (TestCaseGroup *)0x0;
      tcu::TestNode::addChild(local_2d0,&pTVar3->super_TestNode);
      de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
      ~UniqueBase(&sizeLayerGroup.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
    }
  }
  return;
}

Assistant:

void addTestCasesWithFunctions (tcu::TestCaseGroup*						group,
								FunctionPrograms1<CaseDef>::Function	initPrograms,
								FunctionInstance1<CaseDef>::Function	testFunc)
{
	const IVec2 size[] =
	{
		IVec2(64, 64),
		IVec2(79, 31),
	};
	const int numLayers[] =
	{
		1, 4
	};
	const VkSampleCountFlagBits samples[] =
	{
		VK_SAMPLE_COUNT_2_BIT,
		VK_SAMPLE_COUNT_4_BIT,
		VK_SAMPLE_COUNT_8_BIT,
		VK_SAMPLE_COUNT_16_BIT,
		VK_SAMPLE_COUNT_32_BIT,
		VK_SAMPLE_COUNT_64_BIT,
	};
	const VkFormat format[] =
	{
		VK_FORMAT_R8G8B8A8_UNORM,
		VK_FORMAT_R32_UINT,
		VK_FORMAT_R16G16_SINT,
		VK_FORMAT_R32G32B32A32_SFLOAT,
	};

	for (int sizeNdx = 0; sizeNdx < DE_LENGTH_OF_ARRAY(size); ++sizeNdx)
	for (int layerNdx = 0; layerNdx < DE_LENGTH_OF_ARRAY(numLayers); ++layerNdx)
	{
		MovePtr<tcu::TestCaseGroup>	sizeLayerGroup(new tcu::TestCaseGroup(group->getTestContext(), getSizeLayerString(size[sizeNdx], numLayers[layerNdx]).c_str(), ""));
		for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(format); ++formatNdx)
		{
			MovePtr<tcu::TestCaseGroup>	formatGroup(new tcu::TestCaseGroup(group->getTestContext(), getFormatString(format[formatNdx]).c_str(), ""));
			for (int samplesNdx = 0; samplesNdx < DE_LENGTH_OF_ARRAY(samples); ++samplesNdx)
			{
				std::ostringstream caseName;
				caseName << "samples_" << getNumSamples(samples[samplesNdx]);

				const CaseDef caseDef =
				{
					size[sizeNdx],			// IVec2					renderSize;
					numLayers[layerNdx],	// int						numLayers;
					format[formatNdx],		// VkFormat					colorFormat;
					samples[samplesNdx],	// VkSampleCountFlagBits	numSamples;
				};

				addFunctionCaseWithPrograms(formatGroup.get(), caseName.str(), "", initPrograms, testFunc, caseDef);
			}
			sizeLayerGroup->addChild(formatGroup.release());
		}
		group->addChild(sizeLayerGroup.release());
	}
}